

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetMapTypeInternal<duckdb::HistogramFunctor,unsigned_char,duckdb::DefaultMapType<std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>>
          (LogicalType *type)

{
  AggregateFunction *in_RDI;
  LogicalType *in_stack_00000168;
  
  GetHistogramFunction<duckdb::HistogramFunctor,unsigned_char,duckdb::DefaultMapType<std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>>
            (in_stack_00000168);
  return in_RDI;
}

Assistant:

AggregateFunction GetMapTypeInternal(const LogicalType &type) {
	return GetHistogramFunction<OP, T, MAP_TYPE>(type);
}